

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

bool __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::disconnect
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this,
          size_t connection)

{
  size_t in_RSI;
  SignalLink *in_RDI;
  bool local_19;
  
  if (in_RDI->next == (SignalLink *)0x0) {
    local_19 = false;
  }
  else {
    local_19 = SignalLink::remove_sibling(in_RDI,in_RSI);
  }
  return local_19;
}

Assistant:

bool disconnect(size_t connection) {
    return callback_ring_ ? callback_ring_->remove_sibling(connection) : false;
  }